

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall
cmMakefile::AddCustomCommandToOutput
          (cmMakefile *this,unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *cc,
          CommandSourceCallback *callback,bool replace)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outputs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outputs_00;
  cmCustomCommandLines *commandLines;
  pointer pbVar2;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_d0;
  _Any_data local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_88;
  pointer local_80;
  undefined8 local_78;
  code *local_70;
  undefined8 uStack_68;
  cmMakefile *local_60;
  undefined1 local_58;
  _Any_data local_50;
  code *local_40;
  
  outputs = cmCustomCommand::GetOutputs_abi_cxx11_
                      ((cc->_M_t).
                       super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                       .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl);
  outputs_00 = cmCustomCommand::GetByproducts_abi_cxx11_
                         ((cc->_M_t).
                          super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                          .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl);
  commandLines = cmCustomCommand::GetCommandLines
                           ((cc->_M_t).
                            super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                            .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl);
  if ((outputs->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (outputs->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_c8._M_unused._M_object = &local_b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,"Attempt to add a custom rule with no output!","");
    cmSystemTools::Error((string *)&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_unused._0_8_ != &local_b8) {
      operator_delete(local_c8._M_unused._M_object,local_b8._M_allocated_capacity + 1);
    }
  }
  else {
    bVar1 = ValidateCustomCommand(this,commandLines);
    if (bVar1) {
      CreateGeneratedOutputs(this,outputs);
      CreateGeneratedOutputs(this,outputs_00);
      local_b8._M_allocated_capacity = (this->StateSnapshot).Position.Position;
      local_c8._M_unused._M_object = (this->StateSnapshot).State;
      local_c8._8_8_ = (this->StateSnapshot).Position.Tree;
      cmCustomCommand::RecordPolicyValues
                ((cc->_M_t).
                 super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
                 super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
                 super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,
                 (cmStateSnapshot *)&local_c8);
      local_60 = this;
      local_58 = replace;
      std::function<void_(cmSourceFile_*)>::function
                ((function<void_(cmSourceFile_*)> *)&local_50,callback);
      local_d0._M_head_impl =
           (cc->_M_t).super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
           _M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
           super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl;
      (cc->_M_t).super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
      super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
      super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl = (cmCustomCommand *)0x0;
      local_78 = 0;
      pbVar2 = (pointer)operator_new(0x30);
      *(undefined1 *)&pbVar2->_M_string_length = local_58;
      (pbVar2->_M_dataplus)._M_p = (pointer)local_60;
      std::function<void_(cmSourceFile_*)>::function
                ((function<void_(cmSourceFile_*)> *)&pbVar2->field_2,
                 (function<void_(cmSourceFile_*)> *)&local_50);
      local_c8._M_unused._M_object = (void *)0x0;
      local_c8._8_8_ = 0;
      local_b8._M_allocated_capacity = 0;
      local_b8._8_8_ = 0;
      local_90 = std::
                 _Function_handler<void_(cmLocalGenerator_&,_const_cmListFileBacktrace_&,_std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmMakefile.cxx:1279:5)>
                 ::_M_invoke;
      local_a8._8_8_ = local_78;
      local_98 = std::
                 _Function_handler<void_(cmLocalGenerator_&,_const_cmListFileBacktrace_&,_std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmMakefile.cxx:1279:5)>
                 ::_M_manager;
      local_70 = (code *)0x0;
      uStack_68 = 0;
      local_88._M_head_impl = local_d0._M_head_impl;
      local_d0._M_head_impl = (cmCustomCommand *)0x0;
      local_a8._M_unused._0_8_ = (undefined8)pbVar2;
      local_80 = pbVar2;
      AddGeneratorAction(this,(GeneratorAction *)&local_c8);
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_88);
      if (local_98 != (code *)0x0) {
        (*local_98)(&local_a8,&local_a8,3);
      }
      if ((code *)local_b8._M_allocated_capacity != (code *)0x0) {
        (*(code *)local_b8._M_allocated_capacity)(&local_c8,&local_c8,3);
      }
      if (local_70 != (code *)0x0) {
        (*local_70)(&local_80,&local_80,3);
      }
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_d0);
      if (local_40 != (code *)0x0) {
        (*local_40)(&local_50,&local_50,__destroy_functor);
      }
    }
  }
  return;
}

Assistant:

void cmMakefile::AddCustomCommandToOutput(
  std::unique_ptr<cmCustomCommand> cc, const CommandSourceCallback& callback,
  bool replace)
{
  const auto& outputs = cc->GetOutputs();
  const auto& byproducts = cc->GetByproducts();
  const auto& commandLines = cc->GetCommandLines();

  // Make sure there is at least one output.
  if (outputs.empty()) {
    cmSystemTools::Error("Attempt to add a custom rule with no output!");
    return;
  }

  // Validate custom commands.
  if (!this->ValidateCustomCommand(commandLines)) {
    return;
  }

  // Always create the output sources and mark them generated.
  this->CreateGeneratedOutputs(outputs);
  this->CreateGeneratedOutputs(byproducts);

  cc->RecordPolicyValues(this->GetStateSnapshot());

  // Dispatch command creation to allow generator expressions in outputs.
  this->AddGeneratorAction(
    std::move(cc),
    [this, replace, callback](cmLocalGenerator& lg,
                              const cmListFileBacktrace& lfbt,
                              std::unique_ptr<cmCustomCommand> tcc) {
      BacktraceGuard guard(this->Backtrace, lfbt);
      tcc->SetBacktrace(lfbt);
      cmSourceFile* sf = detail::AddCustomCommandToOutput(
        lg, cmCommandOrigin::Project, std::move(tcc), replace);
      if (callback && sf) {
        callback(sf);
      }
    });
}